

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O0

Vec_Ptr_t * Aig_ManSupportsRegisters(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  void *pvVar5;
  int local_3c;
  int local_38;
  int i;
  int m;
  int k;
  int iIn;
  int iOut;
  Vec_Int_t *vSupp;
  Vec_Ptr_t *vMatrix;
  Vec_Ptr_t *vSupports;
  Aig_Man_t *p_local;
  
  p_00 = Aig_ManSupports(p);
  iVar1 = Aig_ManRegNum(p);
  p_01 = Vec_PtrStart(iVar1);
  local_3c = 0;
  do {
    iVar1 = Vec_PtrSize(p_00);
    if (iVar1 <= local_3c) {
      Vec_PtrFree(p_00);
      local_3c = 0;
      while( true ) {
        iVar1 = Vec_PtrSize(p_01);
        if (iVar1 <= local_3c) {
          return p_01;
        }
        pvVar5 = Vec_PtrEntry(p_01,local_3c);
        if (pvVar5 == (void *)0x0) break;
        local_3c = local_3c + 1;
      }
      __assert_fail("vSupp != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                    ,0x1c7,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
    }
    p_02 = (Vec_Int_t *)Vec_PtrEntry(p_00,local_3c);
    iVar2 = Vec_IntPop(p_02);
    iVar1 = Aig_ManCoNum(p);
    iVar3 = Aig_ManRegNum(p);
    iVar2 = iVar2 - (iVar1 - iVar3);
    if (iVar2 < 0) {
      Vec_IntFree(p_02);
    }
    else {
      local_38 = 0;
      for (i = 0; iVar1 = Vec_IntSize(p_02), i < iVar1; i = i + 1) {
        iVar4 = Vec_IntEntry(p_02,i);
        iVar1 = Aig_ManCiNum(p);
        iVar3 = Aig_ManRegNum(p);
        iVar4 = iVar4 - (iVar1 - iVar3);
        if (-1 < iVar4) {
          iVar1 = Aig_ManRegNum(p);
          if (iVar1 <= iVar4) {
            __assert_fail("iIn < Aig_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                          ,0x1bc,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
          }
          Vec_IntWriteEntry(p_02,local_38,iVar4);
          local_38 = local_38 + 1;
        }
      }
      Vec_IntShrink(p_02,local_38);
      iVar1 = Aig_ManRegNum(p);
      if (iVar1 <= iVar2) {
        __assert_fail("iOut < Aig_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigPart.c"
                      ,0x1c1,"Vec_Ptr_t *Aig_ManSupportsRegisters(Aig_Man_t *)");
      }
      Vec_PtrWriteEntry(p_01,iVar2,p_02);
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Aig_ManSupportsRegisters( Aig_Man_t * p )
{
    Vec_Ptr_t * vSupports, * vMatrix;
    Vec_Int_t * vSupp;
    int iOut, iIn, k, m, i;
    // get structural supports for each output
    vSupports = Aig_ManSupports( p );
    // transforms the supports into the latch dependency matrix
    vMatrix = Vec_PtrStart( Aig_ManRegNum(p) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSupp, i )
    {
        // skip true POs
        iOut = Vec_IntPop( vSupp );
        iOut -= Aig_ManCoNum(p) - Aig_ManRegNum(p);
        if ( iOut < 0 )
        {
            Vec_IntFree( vSupp );
            continue;
        }
        // remove PIs
        m = 0;
        Vec_IntForEachEntry( vSupp, iIn, k )
        {
            iIn -= Aig_ManCiNum(p) - Aig_ManRegNum(p);
            if ( iIn < 0 )
                continue;
            assert( iIn < Aig_ManRegNum(p) );
            Vec_IntWriteEntry( vSupp, m++, iIn );
        }
        Vec_IntShrink( vSupp, m );
        // store support in the matrix
        assert( iOut < Aig_ManRegNum(p) );
        Vec_PtrWriteEntry( vMatrix, iOut, vSupp );
    }
    Vec_PtrFree( vSupports );
    // check that all supports are used
    Vec_PtrForEachEntry( Vec_Int_t *, vMatrix, vSupp, i )
        assert( vSupp != NULL );
    return vMatrix;
}